

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  bool bVar1;
  undefined1 uVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumnSortSpecs *__dest;
  ImGuiTableColumnSortSpecs *pIVar4;
  char cVar5;
  long lVar6;
  short sVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  bVar1 = table->IsSortSpecsDirty;
  if (bVar1 == true) {
    TableSortSpecsSanitize(table);
    uVar2 = table->SortSpecsCount;
    iVar10 = (table->SortSpecsMulti).Capacity;
    cVar5 = '\0';
    if ('\x01' < (char)uVar2) {
      cVar5 = uVar2;
    }
    iVar11 = (int)cVar5;
    if (iVar10 < iVar11) {
      if (iVar10 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar10 / 2 + iVar10;
      }
      if (iVar10 <= iVar11) {
        iVar10 = iVar11;
      }
      __dest = (ImGuiTableColumnSortSpecs *)MemAlloc((long)iVar10 * 0xc);
      pIVar4 = (table->SortSpecsMulti).Data;
      if (pIVar4 != (ImGuiTableColumnSortSpecs *)0x0) {
        memcpy(__dest,pIVar4,(long)(table->SortSpecsMulti).Size * 0xc);
        MemFree((table->SortSpecsMulti).Data);
      }
      (table->SortSpecsMulti).Data = __dest;
      (table->SortSpecsMulti).Capacity = iVar10;
    }
    (table->SortSpecsMulti).Size = iVar11;
    (table->SortSpecs).SpecsDirty = true;
    table->IsSortSpecsDirty = false;
  }
  cVar5 = table->SortSpecsCount;
  if (cVar5 == '\0') {
    pIVar4 = (ImGuiTableColumnSortSpecs *)0x0;
  }
  else {
    if (cVar5 == '\x01') {
      pIVar4 = &table->SortSpecsSingle;
    }
    else {
      pIVar4 = (table->SortSpecsMulti).Data;
    }
    if ((bVar1 & pIVar4 != (ImGuiTableColumnSortSpecs *)0x0) == 1) {
      iVar10 = table->ColumnsCount;
      if (0 < iVar10) {
        lVar6 = 0x65;
        sVar7 = 0;
        lVar8 = 0;
        do {
          pIVar3 = (table->Columns).Data;
          cVar5 = *(char *)((long)pIVar3 + lVar6 + -0xf);
          lVar9 = (long)cVar5;
          if (lVar9 != -1) {
            pIVar4[lVar9].ColumnUserID = *(ImGuiID *)((long)pIVar3 + lVar6 + -0x35);
            pIVar4[lVar9].ColumnIndex = (short)(char)((ushort)sVar7 >> 8);
            pIVar4[lVar9].SortOrder = (short)cVar5;
            pIVar4[lVar9].field_0x8 = *(byte *)((long)&pIVar3->Flags + lVar6) & 3;
            iVar10 = table->ColumnsCount;
          }
          lVar8 = lVar8 + 1;
          sVar7 = sVar7 + 0x100;
          lVar6 = lVar6 + 0x68;
        } while (lVar8 < iVar10);
        cVar5 = table->SortSpecsCount;
      }
    }
  }
  (table->SortSpecs).Specs = pIVar4;
  (table->SortSpecs).SpecsCount = (int)cVar5;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    bool dirty = table->IsSortSpecsDirty;
    if (dirty)
    {
        TableSortSpecsSanitize(table);
        table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
        table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
        table->IsSortSpecsDirty = false; // Mark as not dirty for us
    }

    // Write output
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    if (dirty && sort_specs != NULL)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->SortOrder == -1)
                continue;
            IM_ASSERT(column->SortOrder < table->SortSpecsCount);
            ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
            sort_spec->ColumnUserID = column->UserID;
            sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
            sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
            sort_spec->SortDirection = column->SortDirection;
        }

    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
}